

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vdbeIncrMergerNew(SortSubtask *pTask,MergeEngine *pMerger,IncrMerger **ppOut)

{
  i64 *piVar1;
  int iVar2;
  IncrMerger *pIVar3;
  int iVar4;
  
  if (sqlite3Config.xTestCallback != (_func_int_int *)0x0) {
    iVar2 = (*sqlite3Config.xTestCallback)(100);
    if (iVar2 != 0) {
      pIVar3 = (IncrMerger *)0x0;
      goto LAB_00169bd9;
    }
  }
  pIVar3 = (IncrMerger *)sqlite3Malloc(0x48);
  if (pIVar3 != (IncrMerger *)0x0) {
    pIVar3->aFile[0].iEof = 0;
    pIVar3->aFile[1].pFd = (sqlite3_file *)0x0;
    *(undefined8 *)&pIVar3->bUseThread = 0;
    pIVar3->aFile[0].pFd = (sqlite3_file *)0x0;
    pIVar3->iStartOff = 0;
    pIVar3->mxSz = 0;
    pIVar3->bEof = 0;
    pIVar3->pTask = (SortSubtask *)0x0;
    pIVar3->pMerger = (MergeEngine *)0x0;
    pIVar3->aFile[1].iEof = 0;
  }
LAB_00169bd9:
  *ppOut = pIVar3;
  if (pIVar3 == (IncrMerger *)0x0) {
    vdbeMergeEngineFree(pMerger);
    iVar2 = 7;
  }
  else {
    pIVar3->pMerger = pMerger;
    pIVar3->pTask = pTask;
    iVar4 = pTask->pSorter->mxKeysize + 9;
    iVar2 = pTask->pSorter->mxPmaSize / 2;
    if (iVar2 < iVar4) {
      iVar2 = iVar4;
    }
    pIVar3->mxSz = iVar2;
    piVar1 = &(pTask->file2).iEof;
    *piVar1 = *piVar1 + (long)iVar2;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int vdbeIncrMergerNew(
  SortSubtask *pTask,     /* The thread that will be using the new IncrMerger */
  MergeEngine *pMerger,   /* The MergeEngine that the IncrMerger will control */
  IncrMerger **ppOut      /* Write the new IncrMerger here */
){
  int rc = SQLITE_OK;
  IncrMerger *pIncr = *ppOut = (IncrMerger*)
       (sqlite3FaultSim(100) ? 0 : sqlite3MallocZero(sizeof(*pIncr)));
  if( pIncr ){
    pIncr->pMerger = pMerger;
    pIncr->pTask = pTask;
    pIncr->mxSz = MAX(pTask->pSorter->mxKeysize+9,pTask->pSorter->mxPmaSize/2);
    pTask->file2.iEof += pIncr->mxSz;
  }else{
    vdbeMergeEngineFree(pMerger);
    rc = SQLITE_NOMEM_BKPT;
  }
  assert( *ppOut!=0 || rc!=SQLITE_OK );
  return rc;
}